

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::splice_string(CTcTokenizer *this)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  wchar_t wVar7;
  size_t sVar8;
  char *__n;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  utf8_ptr local_48;
  char unterm;
  uint local_3c;
  CTcTokString *local_38;
  
  unterm = '\0';
  uVar2 = (this->linebuf_).buf_len_;
  local_3c = 0;
  if (1 < uVar2) {
    local_3c = (uint)(*(short *)((this->linebuf_).buf_ + (uVar2 - 2)) == 0x6e5c);
  }
  wVar7 = this->in_quote_;
  iVar1 = this->in_triple_;
  local_38 = &this->linebuf_;
  local_48.p_ = (char *)0x0;
LAB_0024b950:
  sVar8 = 2;
  pcVar9 = "\\n";
  if (this->string_newline_spacing_ == NEWLINE_SPACING_PRESERVE) {
LAB_0024b97a:
    CTcTokString::append(local_38,pcVar9,sVar8);
  }
  else if ((this->string_newline_spacing_ == NEWLINE_SPACING_COLLAPSE) && (local_3c == 0)) {
    pcVar9 = " ";
    sVar8 = 1;
    goto LAB_0024b97a;
  }
  iVar3 = read_line(this,1);
  if (iVar3 != -1) {
    pcVar9 = (this->linebuf_).buf_ + iVar3;
    local_48.p_ = pcVar9;
    if ((this->string_newline_spacing_ != NEWLINE_SPACING_PRESERVE) && (local_3c == 0)) {
      while( true ) {
        wVar4 = utf8_ptr::s_getch(local_48.p_);
        iVar5 = is_space(wVar4);
        if (iVar5 == 0) break;
        local_48.p_ = utf8_ptr::s_inc(local_48.p_);
      }
    }
    sVar8 = (this->linebuf_).buf_len_;
    local_3c = 0;
    if (1 < sVar8 - (long)iVar3) {
      local_3c = (uint)(*(short *)((this->linebuf_).buf_ + (sVar8 - 2)) == 0x6e5c);
    }
    if (pcVar9 < local_48.p_) {
      pcVar10 = (this->linebuf_).buf_;
      __n = pcVar10 + (sVar8 - (long)local_48.p_);
      pcVar10 = pcVar9 + ((long)__n - (long)pcVar10);
      memmove(pcVar9,local_48.p_,(size_t)__n);
      (this->linebuf_).buf_len_ = (size_t)pcVar10;
      if (pcVar10 < (char *)(this->linebuf_).buf_size_) {
        (this->linebuf_).buf_[(long)pcVar10] = '\0';
      }
    }
    local_48.p_ = pcVar9;
    wVar4 = utf8_ptr::s_getch(pcVar9);
    if ((wVar4 == L'}') || (wVar4 = utf8_ptr::s_getch(local_48.p_), wVar4 == L';')) {
      do {
        local_48.p_ = utf8_ptr::s_inc(local_48.p_);
        wVar4 = utf8_ptr::s_getch(local_48.p_);
        iVar3 = is_space(wVar4);
      } while (iVar3 != 0);
      wVar4 = utf8_ptr::s_getch(local_48.p_);
      if (wVar4 == L'\0') {
        log_error(0x2743,this->appended_linenum_);
        this->in_quote_ = L'\0';
        unterm = (char)wVar7;
        process_comments(this,(long)pcVar9 - (long)(this->linebuf_).buf_);
        bVar11 = (char)wVar7 == '\0';
        local_48.p_ = pcVar9;
LAB_0024bbbd:
        if (local_48.p_ != (char *)0x0) {
          unsplice_line(this,local_48.p_);
        }
        if (!bVar11) {
          CTcTokString::append(local_38,&unterm,1);
        }
        return;
      }
    }
    do {
      local_48.p_ = pcVar9;
      wVar4 = utf8_ptr::s_getch(pcVar9);
      if (wVar4 == L'\\') {
        local_48.p_ = utf8_ptr::s_inc(local_48.p_);
        if ((iVar1 == 0) || (wVar4 = utf8_ptr::s_getch(local_48.p_), wVar4 != wVar7)) {
          wVar4 = utf8_ptr::s_getch(local_48.p_);
          if (wVar4 == L'<') {
            while (wVar4 = utf8_ptr::s_getch(local_48.p_), wVar4 == L'<') {
              local_48.p_ = utf8_ptr::s_inc(local_48.p_);
            }
          }
        }
        else {
          iVar3 = count_quotes(&local_48,wVar7);
          utf8_ptr::inc_by(&local_48,(long)(iVar3 + -1));
        }
      }
      else if (wVar4 == wVar7) {
        if (iVar1 == 0) {
          local_48.p_ = utf8_ptr::s_inc(local_48.p_);
          break;
        }
        uVar6 = count_quotes(&local_48,wVar7);
        if (2 < (int)uVar6) {
          utf8_ptr::inc_by(&local_48,(ulong)uVar6);
          break;
        }
      }
      else if (wVar4 == L'<') {
        wVar4 = utf8_ptr::s_getch_at(local_48.p_,1);
        if (wVar4 == L'<') {
          local_48.p_ = utf8_ptr::s_inc(local_48.p_);
          local_48.p_ = utf8_ptr::s_inc(local_48.p_);
          wVar7 = utf8_ptr::s_getch(local_48.p_);
          if (wVar7 == L'%') {
            scan_sprintf_spec(this,&local_48);
          }
          break;
        }
      }
      else if (wVar4 == L'\0') goto LAB_0024b950;
      pcVar9 = utf8_ptr::s_inc(local_48.p_);
    } while( true );
  }
  bVar11 = true;
  goto LAB_0024bbbd;
}

Assistant:

void CTcTokenizer::splice_string()
{
    /* presume we'll find proper termination */
    char unterm = '\0';

    /* 
     *   remember the current in-quote and in-embedding status, as of the
     *   end of the current line - when we splice, the line reader will
     *   update these to the status at the end of the newly-read material,
     *   but we want to scan from the beginning of the newly-read material 
     */
    wchar_t in_quote = in_quote_;
    int in_triple = in_triple_;

    /* note if the previous line ended with an explicit \n sequence */
    int explicit_nl = (linebuf_.get_text_len() >= 2
                       && memcmp(linebuf_.get_text_end() - 2, "\\n", 2) == 0);
        
    /* keep going until we find the end of the string */
    utf8_ptr p((char *)0);
    for (;;)
    {
        /* apply the newline spacing mode */
        switch (string_newline_spacing_)
        {
        case NEWLINE_SPACING_COLLAPSE:
            /* 
             *   Replace the newline and any subsequent run of whitespace
             *   characters with a single space, unless the last line ended
             *   with an explicit newline.
             */
            if (!explicit_nl)
                linebuf_.append(" ", 1);
            break;

        case NEWLINE_SPACING_DELETE:
            /* delete the newline and subsequent whitespace */
            break;

        case NEWLINE_SPACING_PRESERVE:
            /* 
             *   preserve the newline and subsequent whitespace exactly as
             *   written in the source code, so convert the newline to an
             *   explicit \n sequence (in source form, since we're building a
             *   source line at this point)
             */
            linebuf_.append("\\n", 2);
            break;
        }

        /* splice another line */
        int new_line_ofs = read_line(TRUE);

        /* if we reached end of file, there's no more splicing we can do */
        if (new_line_ofs == -1)
            break;

        /* get a pointer to the new text */
        char *new_line_p = (char *)linebuf_.get_text() + new_line_ofs;
        p.set(new_line_p);

        /* 
         *   If we're in COLLAPSE or DELETE mode for newline spacing, skip
         *   leading spaces in the new line.  However, override this if the
         *   previous line ended with an explicit \n sequence; this tells us
         *   that the line break is explicitly part of the string and that
         *   the subsequent whitespace is to be preserved.
         */
        if (string_newline_spacing_ != NEWLINE_SPACING_PRESERVE
            && !explicit_nl)
            for ( ; is_space(p.getch()) ; p.inc()) ;

        /* check to see if the newly spliced text ends in an explicit \n */
        explicit_nl = (linebuf_.get_text_len() - new_line_ofs >= 2
                       && memcmp(linebuf_.get_text_end() - 2, "\\n", 2) == 0);

        /* if we skipped any spaces, remove them from the text */
        if (p.getptr() > new_line_p)
        {
            /* calculate the length of the rest of the line */
            size_t rem = linebuf_.get_text_len()
                         - (p.getptr() - linebuf_.get_buf());

            /* calculate the new length of the line */
            size_t new_len = (new_line_p - linebuf_.get_buf()) + rem;

            /* move the rest of the line down over the spaces */
            memmove(new_line_p, p.getptr(), rem);

            /* set the new length */
            linebuf_.set_text_len(new_len);
        }

        /* 
         *   If the new line contains only "}" or ";", presume that the
         *   string is unterminated and terminate it here.  (This
         *   heuristic could flag well-formed strings as erroneous, but
         *   users can always work around this by moving these characters
         *   onto lines that contain at least one other non-whitespace
         *   character.)  
         */
        p.set(new_line_p);
        if (p.getch() == '}' || p.getch() == ';')
        {
            /* skip trailing whitespace */
            for (p.inc() ; is_space(p.getch()) ; p.inc()) ;
            
            /* 
             *   if there's nothing else on the line, presume it's an
             *   unterminated string 
             */
            if (p.getch() == '\0')
            {
                /* log the error */
                log_error(TCERR_POSSIBLE_UNTERM_STR,
                          appended_linenum_);

                /* remember that it's unterminated */
                unterm = (char)in_quote;

                /* 
                 *   since we're adding a presumed close quote that never
                 *   appears in the text, we need to figure the new
                 *   in-string status for the line; clear the in-quote
                 *   flag, and re-scan comments from the current point on
                 *   the line 
                 */
                in_quote_ = '\0';
                process_comments(new_line_p - linebuf_.get_buf());

                /* we're done - unsplice from the start of the new line */
                p.set(new_line_p);
                goto done;
            }
        }

        /* scan for the end of the string */
        for (p.set(new_line_p) ; ; p.inc())
        {
            /* get this character */
            wchar_t cur = p.getch();

            /* see what we have */
            if (cur == '\\')
            {
                /* it's a backslash sequence - skip the extra character */
                p.inc();

                /* 
                 *   in a triple-quoted string, a backslash escapes a whole
                 *   run of consecutive quote characters 
                 */
                if (in_triple && p.getch() == in_quote)
                {
                    /* skip all but the last consecutive quote */
                    int qcnt = count_quotes(&p, in_quote);
                    p.inc_by(qcnt - 1);
                }
                else if (p.getch() == '<')
                {
                    /* skip a run of <'s */
                    for ( ; p.getch() == '<' ; p.inc()) ;
                }
            }
            else if (cur == in_quote)
            {
                /* it's our quote character - check for triple quotes */
                if (in_triple)
                {
                    /* in a triple-quoted string - we need 3+ to end it */
                    int qcnt = count_quotes(&p, cur);
                    if (qcnt >= 3)
                    {
                        /* we have at least 3 - skip them and exit */
                        p.inc_by(qcnt);
                        goto done;
                    }
                }
                else
                {
                    /* regular string - skip it and exit the string */
                    p.inc();
                    goto done;
                }
            }
            else if (cur == '<' && p.getch_at(1) == '<')
            {
                /* 
                 *   it's an embedded expression starter - skip the '<<'
                 *   sequence and stop scanning 
                 */
                p.inc();
                p.inc();

                /* check for a '%' sprintf code */
                if (p.getch() == '%')
                    scan_sprintf_spec(&p);

                /* done */
                goto done;
            }
            else if (cur == '\0')
            {
                /* end of line - go back and splice another line */
                break;
            }
        }
    }

done:
    /* if we actually spliced anything, unsplice it at the current point */
    if (p.getptr() != 0)
        unsplice_line(p.getptr());

    /* if we found an unterminated string, supply implicit termination */
    if (unterm != '\0')
        linebuf_.append(&unterm, 1);
}